

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O3

u32 deflate_compute_true_cost(libdeflate_compressor *c)

{
  uint uVar1;
  u32 uVar2;
  long lVar3;
  
  deflate_precompute_huffman_header(c);
  uVar1 = (c->o).precode.num_litlen_syms;
  lVar3 = 0;
  memset((c->codes).lens.litlen + uVar1,0,(ulong)(0x120 - uVar1));
  uVar2 = (c->o).precode.num_explicit_lens * 3 + 0xe;
  do {
    uVar2 = uVar2 + ((uint)""[lVar3] + (uint)*(byte *)((long)&c->o + lVar3 + 0x98)) *
                    *(int *)((long)&c->o + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x13);
  lVar3 = -0x101;
  do {
    uVar2 = uVar2 + (uint)(c->codes).lens.offset[lVar3 + -0x1f] * (c->freqs).offset[lVar3 + -0x1f];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0);
  lVar3 = 0;
  do {
    uVar2 = uVar2 + ((uint)""[lVar3] + (uint)(c->codes).lens.offset[lVar3 + -0x1f]) *
                    (c->freqs).offset[lVar3 + -0x1f];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1d);
  lVar3 = 0;
  do {
    uVar2 = uVar2 + ((uint)""[lVar3] + (uint)(c->codes).lens.offset[lVar3]) *
                    (c->freqs).offset[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x1e);
  return uVar2;
}

Assistant:

static u32
deflate_compute_true_cost(struct libdeflate_compressor *c)
{
	u32 cost = 0;
	unsigned sym;

	deflate_precompute_huffman_header(c);

	memset(&c->codes.lens.litlen[c->o.precode.num_litlen_syms], 0,
	       DEFLATE_NUM_LITLEN_SYMS - c->o.precode.num_litlen_syms);

	cost += 5 + 5 + 4 + (3 * c->o.precode.num_explicit_lens);
	for (sym = 0; sym < DEFLATE_NUM_PRECODE_SYMS; sym++) {
		cost += c->o.precode.freqs[sym] *
			(c->o.precode.lens[sym] +
			 deflate_extra_precode_bits[sym]);
	}

	for (sym = 0; sym < DEFLATE_FIRST_LEN_SYM; sym++)
		cost += c->freqs.litlen[sym] * c->codes.lens.litlen[sym];

	for (; sym < DEFLATE_FIRST_LEN_SYM +
	       ARRAY_LEN(deflate_extra_length_bits); sym++)
		cost += c->freqs.litlen[sym] *
			(c->codes.lens.litlen[sym] +
			 deflate_extra_length_bits[sym - DEFLATE_FIRST_LEN_SYM]);

	for (sym = 0; sym < ARRAY_LEN(deflate_extra_offset_bits); sym++)
		cost += c->freqs.offset[sym] *
			(c->codes.lens.offset[sym] +
			 deflate_extra_offset_bits[sym]);
	return cost;
}